

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestream.cc
# Opt level: O3

void __thiscall google::protobuf::strings::ArrayByteSource::Skip(ArrayByteSource *this,size_t n)

{
  LogMessage *other;
  ulong uVar1;
  LogMessage local_60;
  LogFinisher local_21;
  
  uVar1 = (this->input_).length_;
  if (uVar1 < n) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/stubs/bytestream.cc"
               ,0x9d);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (n) <= (input_.size()): ");
    internal::LogFinisher::operator=(&local_21,other);
    internal::LogMessage::~LogMessage(&local_60);
    uVar1 = (this->input_).length_;
  }
  if ((long)n <= (long)uVar1) {
    (this->input_).ptr_ = (this->input_).ptr_ + n;
    (this->input_).length_ = uVar1 - n;
    return;
  }
  __assert_fail("length_ >= n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/stubs/stringpiece.h"
                ,0x11b,"void google::protobuf::StringPiece::remove_prefix(stringpiece_ssize_type)");
}

Assistant:

void ArrayByteSource::Skip(size_t n) {
  GOOGLE_DCHECK_LE(n, input_.size());
  input_.remove_prefix(n);
}